

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O1

void __thiscall
AlignmentRecord::pairWith(AlignmentRecord *this,BamAlignment *alignment,string *mainReference)

{
  vector<char,_std::allocator<char>_> *this_00;
  pointer *ppcVar1;
  pointer pCVar2;
  iterator iVar3;
  pointer pmVar4;
  pointer pcVar5;
  pointer pcVar6;
  uint uVar7;
  size_t sVar8;
  string *psVar9;
  long lVar10;
  AlignmentRecord *pAVar11;
  bool bVar12;
  uint uVar13;
  pointer pCVar14;
  int iVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  codesAndQuality2;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref2;
  string querySequence;
  undefined1 local_3c8 [24];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390;
  undefined1 local_380 [16];
  undefined1 local_370 [24];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_358;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  char local_338 [16];
  string *local_328;
  string *local_320;
  string local_318;
  vector<int,_std::allocator<int>_> *local_2f8;
  string *local_2f0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2e8;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2e0;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2d8;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2d0;
  string *local_2c8;
  vector<int,_std::allocator<int>_> local_2c0;
  vector<int,_std::allocator<int>_> local_2a8;
  vector<int,_std::allocator<int>_> local_290;
  vector<int,_std::allocator<int>_> local_278;
  vector<char,_std::allocator<char>_> local_260;
  vector<char,_std::allocator<char>_> local_248;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar15 = *(int *)(alignment + 0xac);
  bVar12 = SUB81(alignment,0);
  if (this->end1 < iVar15 + 1U) {
    this->single_end = false;
    this->start2 = iVar15 + 1U;
    iVar15 = 0;
    local_320 = mainReference;
    uVar7 = BamTools::BamAlignment::GetEndPosition(bVar12,false);
    this->end2 = uVar7;
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
              (&this->cigar2,
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(alignment + 0xb8));
    local_328 = (string *)(alignment + 0x68);
    if (*(long *)(alignment + 0x70) != 0) {
      lVar10 = 0;
      iVar15 = 0;
      do {
        iVar15 = iVar15 + (local_328->_M_dataplus)._M_p[lVar10] + -0x21;
        lVar10 = lVar10 + 1;
      } while (*(long *)(alignment + 0x70) != lVar10);
    }
    this->phred_sum2 = iVar15;
    pCVar14 = (this->cigar2).
              super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar2 = (this->cigar2).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pCVar14 != pCVar2) {
      do {
        uVar7 = pCVar14->Length;
        if (uVar7 != 0) {
          uVar13 = 0;
          do {
            iVar3._M_current =
                 (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                        ((vector<char,std::allocator<char>> *)&this->cigar2_unrolled,iVar3,
                         &pCVar14->Type);
            }
            else {
              *iVar3._M_current = pCVar14->Type;
              ppcVar1 = &(this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
              *ppcVar1 = *ppcVar1 + 1;
            }
            uVar13 = uVar13 + 1;
            uVar7 = pCVar14->Length;
          } while (uVar13 < uVar7);
        }
        if ((pCVar14->Type == 'D') &&
           (this->length_incl_deletions2 = this->length_incl_deletions2 + uVar7, 1 < uVar7)) {
          this->length_incl_longdeletions2 = this->length_incl_longdeletions2 + uVar7;
        }
        pCVar14 = pCVar14 + 1;
      } while (pCVar14 != pCVar2);
    }
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_318,*(long *)(alignment + 0x28),
               *(long *)(alignment + 0x30) + *(long *)(alignment + 0x28));
    std::vector<char,_std::allocator<char>_>::vector(&local_248,&this->cigar2_unrolled);
    iVar15 = *(int *)(alignment + 0xac);
    pAVar11 = *(AlignmentRecord **)(alignment + 0x68);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pAVar11,
               (long)&(pAVar11->name)._M_dataplus._M_p + *(long *)(alignment + 0x70));
    referenceString((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                     *)local_380,pAVar11,&local_248,iVar15,&local_318,&local_110,local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if (local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)local_3c8,&local_318,local_328);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward,
              (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_3c8 + 8));
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward_qualities,&local_3b0);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward,&local_3a0);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward_qualities,&local_390);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)local_3c8);
    std::__cxx11::string::_M_assign((string *)&this->reference_seq2);
    std::__cxx11::string::_M_assign((string *)&this->alignSequence2);
    std::vector<int,_std::allocator<int>_>::operator=
              (&this->qualityList2,(vector<int,_std::allocator<int>_> *)local_380);
    sVar8 = ShortDnaSequence::size(&this->sequence2);
    this->length_incl_deletions2 = (int)sVar8;
    sVar8 = ShortDnaSequence::size(&this->sequence2);
    this->length_incl_longdeletions2 = (int)sVar8;
    coveredPositions((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                      *)local_3c8,this);
    pmVar4 = (this->cov_pos).
             super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->cov_pos).
    super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_3c8._0_8_;
    (this->cov_pos).
    super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_3c8._8_8_;
    (this->cov_pos).
    super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3c8._16_8_;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (element_type *)0x0;
    local_3c8._16_8_ = (pointer)0x0;
    if (pmVar4 != (pointer)0x0) {
      operator_delete(pmVar4);
    }
    if ((pointer)local_3c8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_3c8._0_8_);
    }
    if (local_348.px != (element_type *)local_338) {
      operator_delete(local_348.px);
    }
    if ((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_370._8_8_ != &local_358) {
      operator_delete((void *)local_370._8_8_);
    }
    if ((pointer)local_380._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_380._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p == &local_318.field_2) goto LAB_001712d8;
  }
  else {
    iVar15 = 0;
    uVar7 = BamTools::BamAlignment::GetEndPosition(bVar12,false);
    if (this->start1 <= uVar7) {
      getMergedDnaSequence(this,alignment,mainReference);
      goto LAB_001712d8;
    }
    this->single_end = false;
    this->start2 = this->start1;
    this->end2 = this->end1;
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
              (&this->cigar2,&this->cigar1);
    local_2d0 = &(this->sequence1).forward;
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward,local_2d0);
    local_2d8 = &(this->sequence1).forward_qualities;
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward_qualities,local_2d8);
    local_2e0 = &(this->sequence1).backward;
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward,local_2e0);
    local_2e8 = &(this->sequence1).backward_qualities;
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward_qualities,local_2e8);
    local_2c8 = (string *)&this->reference_seq1;
    std::__cxx11::string::_M_assign((string *)&this->reference_seq2);
    local_2f0 = (string *)&this->alignSequence1;
    std::__cxx11::string::_M_assign((string *)&this->alignSequence2);
    std::__cxx11::string::_M_assign((string *)&this->code2);
    local_2f8 = &this->qualityList1;
    std::vector<int,_std::allocator<int>_>::operator=(&this->qualityList2,local_2f8);
    this->phred_sum2 = this->phred_sum1;
    this_00 = &this->cigar1_unrolled;
    std::vector<char,_std::allocator<char>_>::operator=(&this->cigar2_unrolled,this_00);
    this->length_incl_deletions2 = this->length_incl_deletions1;
    this->length_incl_longdeletions2 = this->length_incl_longdeletions1;
    this->start1 = *(int *)(alignment + 0xac) + 1;
    uVar7 = BamTools::BamAlignment::GetEndPosition(bVar12,false);
    this->end1 = uVar7;
    std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
              (&this->cigar1,
               (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(alignment + 0xb8));
    local_328 = (string *)(alignment + 0x68);
    if (*(long *)(alignment + 0x70) != 0) {
      lVar10 = 0;
      iVar15 = 0;
      do {
        iVar15 = iVar15 + (local_328->_M_dataplus)._M_p[lVar10] + -0x21;
        lVar10 = lVar10 + 1;
      } while (*(long *)(alignment + 0x70) != lVar10);
    }
    this->phred_sum1 = iVar15;
    pcVar5 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar5) {
      (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar5;
    }
    pCVar2 = (this->cigar1).
             super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_320 = mainReference;
    for (pCVar14 = (this->cigar1).
                   super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl
                   .super__Vector_impl_data._M_start; pCVar14 != pCVar2; pCVar14 = pCVar14 + 1) {
      uVar7 = pCVar14->Length;
      if (uVar7 != 0) {
        uVar13 = 0;
        do {
          iVar3._M_current =
               (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)this_00,iVar3,&pCVar14->Type);
          }
          else {
            *iVar3._M_current = pCVar14->Type;
            ppcVar1 = &(this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          uVar13 = uVar13 + 1;
          uVar7 = pCVar14->Length;
        } while (uVar13 < uVar7);
      }
      if ((pCVar14->Type == 'D') &&
         (this->length_incl_deletions1 = this->length_incl_deletions1 + uVar7, 1 < uVar7)) {
        this->length_incl_longdeletions1 = this->length_incl_longdeletions1 + uVar7;
      }
    }
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_318,*(long *)(alignment + 0x28),
               *(long *)(alignment + 0x30) + *(long *)(alignment + 0x28));
    std::vector<char,_std::allocator<char>_>::vector(&local_260,this_00);
    iVar15 = *(int *)(alignment + 0xac);
    pAVar11 = *(AlignmentRecord **)(alignment + 0x68);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pAVar11,
               (long)&(pAVar11->name)._M_dataplus._M_p + *(long *)(alignment + 0x70));
    psVar9 = local_328;
    referenceString((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                     *)local_380,pAVar11,&local_260,iVar15,&local_318,&local_130,local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if (local_260.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_260.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)local_3c8,&local_318,psVar9);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(local_2d0,
              (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_3c8 + 8));
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(local_2d8,&local_3b0);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(local_2e0,&local_3a0);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(local_2e8,&local_390);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)local_3c8);
    std::__cxx11::string::_M_assign(local_2c8);
    std::__cxx11::string::_M_assign(local_2f0);
    std::vector<int,_std::allocator<int>_>::operator=
              (local_2f8,(vector<int,_std::allocator<int>_> *)local_380);
    sVar8 = ShortDnaSequence::size(&this->sequence1);
    this->length_incl_deletions1 = (int)sVar8;
    sVar8 = ShortDnaSequence::size(&this->sequence1);
    this->length_incl_longdeletions1 = (int)sVar8;
    coveredPositions((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
                      *)local_3c8,this);
    pmVar4 = (this->cov_pos).
             super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (this->cov_pos).
    super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_3c8._0_8_;
    (this->cov_pos).
    super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_3c8._8_8_;
    (this->cov_pos).
    super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3c8._16_8_;
    local_3c8._0_8_ = (pointer)0x0;
    local_3c8._8_8_ = (element_type *)0x0;
    local_3c8._16_8_ = (pointer)0x0;
    if (pmVar4 != (pointer)0x0) {
      operator_delete(pmVar4);
    }
    if ((pointer)local_3c8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_3c8._0_8_);
    }
    if (local_348.px != (element_type *)local_338) {
      operator_delete(local_348.px);
    }
    if ((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)local_370._8_8_ != &local_358) {
      operator_delete((void *)local_370._8_8_);
    }
    if ((pointer)local_380._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_380._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p == &local_318.field_2) goto LAB_001712d8;
  }
  operator_delete(local_318._M_dataplus._M_p);
LAB_001712d8:
  if (this->strand1 == true) {
    pcVar6 = (this->reference_seq1)._M_dataplus._M_p;
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_150,pcVar6,pcVar6 + (this->reference_seq1)._M_string_length);
    pcVar6 = (this->alignSequence1)._M_dataplus._M_p;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar6,pcVar6 + (this->alignSequence1)._M_string_length);
    std::vector<int,_std::allocator<int>_>::vector(&local_278,&this->qualityList1);
    CTandCTOTReadCoder((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_380,&local_150,&local_170,&local_278,'G','C','T');
    if (local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_278.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&this->code1);
    std::__cxx11::string::_M_assign((string *)&this->gcQuality1);
    pcVar6 = (this->reference_seq2)._M_dataplus._M_p;
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_190,pcVar6,pcVar6 + (this->reference_seq2)._M_string_length);
    pcVar6 = (this->alignSequence2)._M_dataplus._M_p;
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,pcVar6,pcVar6 + (this->alignSequence2)._M_string_length);
    std::vector<int,_std::allocator<int>_>::vector(&local_290,&this->qualityList2);
    CTandCTOTReadCoder((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3c8,&local_190,&local_1b0,&local_290,'G','C','T');
    if (local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_290.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&this->code2);
    std::__cxx11::string::_M_assign((string *)&this->gcQuality2);
  }
  else {
    psVar9 = ShortDnaSequence::toString_abi_cxx11_(&this->sequence1);
    pcVar6 = (psVar9->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar6,pcVar6 + psVar9->_M_string_length);
    complement((string *)local_3c8,&local_50);
    psVar9 = ShortDnaSequence::qualityString_abi_cxx11_(&this->sequence1);
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)local_380,(string *)local_3c8,psVar9);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence1).forward,
              (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_380 + 8));
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence1).forward_qualities,
              (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_370 + 8));
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence1).backward,&local_358);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence1).backward_qualities,&local_348);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)local_380);
    if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
      operator_delete((void *)local_3c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pcVar6 = (this->reference_seq1)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar6,pcVar6 + (this->reference_seq1)._M_string_length);
    complement((string *)local_380,&local_70);
    std::__cxx11::string::operator=((string *)&this->reference_seq1,(string *)local_380);
    if ((pointer)local_380._0_8_ != (pointer)local_370) {
      operator_delete((void *)local_380._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pcVar6 = (this->alignSequence1)._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar6,pcVar6 + (this->alignSequence1)._M_string_length);
    complement((string *)local_380,&local_90);
    std::__cxx11::string::operator=((string *)&this->alignSequence1,(string *)local_380);
    if ((pointer)local_380._0_8_ != (pointer)local_370) {
      operator_delete((void *)local_380._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    psVar9 = ShortDnaSequence::toString_abi_cxx11_(&this->sequence2);
    pcVar6 = (psVar9->_M_dataplus)._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar6,pcVar6 + psVar9->_M_string_length);
    complement((string *)local_3c8,&local_b0);
    psVar9 = ShortDnaSequence::qualityString_abi_cxx11_(&this->sequence2);
    ShortDnaSequence::ShortDnaSequence((ShortDnaSequence *)local_380,(string *)local_3c8,psVar9);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward,
              (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_380 + 8));
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).forward_qualities,
              (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_370 + 8));
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward,&local_358);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&(this->sequence2).backward_qualities,&local_348);
    ShortDnaSequence::~ShortDnaSequence((ShortDnaSequence *)local_380);
    if ((pointer)local_3c8._0_8_ != (pointer)(local_3c8 + 0x10)) {
      operator_delete((void *)local_3c8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    pcVar6 = (this->reference_seq2)._M_dataplus._M_p;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar6,pcVar6 + (this->reference_seq2)._M_string_length);
    complement((string *)local_380,&local_d0);
    std::__cxx11::string::operator=((string *)&this->reference_seq2,(string *)local_380);
    if ((pointer)local_380._0_8_ != (pointer)local_370) {
      operator_delete((void *)local_380._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    pcVar6 = (this->alignSequence2)._M_dataplus._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar6,pcVar6 + (this->alignSequence2)._M_string_length);
    complement((string *)local_380,&local_f0);
    std::__cxx11::string::operator=((string *)&this->alignSequence2,(string *)local_380);
    if ((pointer)local_380._0_8_ != (pointer)local_370) {
      operator_delete((void *)local_380._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    pcVar6 = (this->reference_seq1)._M_dataplus._M_p;
    local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d0,pcVar6,pcVar6 + (this->reference_seq1)._M_string_length);
    pcVar6 = (this->alignSequence1)._M_dataplus._M_p;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f0,pcVar6,pcVar6 + (this->alignSequence1)._M_string_length);
    std::vector<int,_std::allocator<int>_>::vector(&local_2a8,&this->qualityList1);
    OBandCTOBReadCoder((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_380,&local_1d0,&local_1f0,&local_2a8,'G','C','T');
    if (local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&this->code1);
    std::__cxx11::string::_M_assign((string *)&this->gcQuality1);
    pcVar6 = (this->reference_seq2)._M_dataplus._M_p;
    local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_210,pcVar6,pcVar6 + (this->reference_seq2)._M_string_length);
    pcVar6 = (this->alignSequence2)._M_dataplus._M_p;
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar6,pcVar6 + (this->alignSequence2)._M_string_length);
    std::vector<int,_std::allocator<int>_>::vector(&local_2c0,&this->qualityList2);
    OBandCTOBReadCoder((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3c8,&local_210,&local_230,&local_2c0,'G','C','T');
    if (local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_2c0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    std::__cxx11::string::_M_assign((string *)&this->code2);
    std::__cxx11::string::_M_assign((string *)&this->gcQuality2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_380);
  return;
}

Assistant:

void AlignmentRecord::pairWith(const BamTools::BamAlignment& alignment, string &mainReference) {

    if ((unsigned)(alignment.Position+1) > this->end1) {
        this->single_end = false;
        this->start2 = alignment.Position + 1;
        this->end2 = alignment.GetEndPosition();
        if (!(this->end2 > 0)){
            //cout << this->name << " end: " << this->end2 << endl;
        }
        this->cigar2 = alignment.CigarData;

        this->phred_sum2 = phred_sum(alignment.Qualities);


        for (const auto& it : cigar2) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                this->cigar2_unrolled.push_back(it.Type);
            }
            if (it.Type == 'D') {
                this->length_incl_deletions2+=it.Length;
                if (it.Length > 1) {
                    this->length_incl_longdeletions2+=it.Length;
                }
            }
        }
        //NoMe Additions
        string querySequence = alignment.QueryBases;
        std::tuple<string,string,vector<int>> ref2 = referenceString(this->getCigar2Unrolled(),alignment.Position,querySequence,alignment.Qualities,mainReference);

        this->sequence2 = ShortDnaSequence(querySequence, alignment.Qualities);

        this->reference_seq2=std::get<0>(ref2);
        this->alignSequence2=std::get<1>(ref2);
        this->qualityList2 = std::get<2>(ref2);

        this->length_incl_deletions2 = this->sequence2.size();
        this->length_incl_longdeletions2 = this->sequence2.size();
        //End NoMe Additions
        this->cov_pos = this->coveredPositions();

    } else if ((unsigned)alignment.GetEndPosition() < this->start1) {
        this->single_end = false;
        this->start2 = this->start1;
        this->end2 = this->end1;
        this->cigar2 = this->cigar1;
        this->sequence2 = this->sequence1;
        this->reference_seq2 = this->reference_seq1;
        this->alignSequence2 = this->alignSequence1;
        this->code2 = this->code1;
        this->qualityList2 = this->qualityList1;
        this->phred_sum2 = this->phred_sum1;
        this->cigar2_unrolled = this->cigar1_unrolled;
        this->length_incl_deletions2 = this->length_incl_deletions1;
        this->length_incl_longdeletions2 = this->length_incl_longdeletions1;

        this->start1 = alignment.Position + 1;
        this->end1 = alignment.GetEndPosition();
        this->cigar1 = alignment.CigarData;

        this->phred_sum1 = phred_sum(alignment.Qualities);

        this->cigar1_unrolled.clear();
        for (const auto& it : cigar1) {
            for (unsigned int s = 0; s < it.Length; ++s) {
                this->cigar1_unrolled.push_back(it.Type);
            }
            if (it.Type == 'D') {
                this->length_incl_deletions1+=it.Length;
                if (it.Length > 1) {
                    this->length_incl_longdeletions1+=it.Length;
                }
            }
        }

        //NoMe Additions
        string querySequence = alignment.QueryBases;
        std::tuple<string,string,vector<int>> ref3 = referenceString(this->getCigar1Unrolled(),alignment.Position,querySequence,alignment.Qualities,mainReference);

        this->sequence1 = ShortDnaSequence(querySequence, alignment.Qualities);
        this->reference_seq1 = std::get<0>(ref3);
        this->alignSequence1 = std::get<1>(ref3);
        this->qualityList1 = std::get<2>(ref3);

        this->length_incl_deletions1 = this->sequence1.size();
        this->length_incl_longdeletions1 = this->sequence1.size();

        //End NoMe Additions
        this->cov_pos = this->coveredPositions();
        if(this->reference_seq1.size()-1!=this->cigar1_unrolled.size()){
            assert(false);
        }
    }//merging of overlapping paired ends to single end reads
    else {
        this->getMergedDnaSequence(alignment,mainReference);
    }

    //Reverse Complementing the pair 1 and two based on which strand they come from
    if(this->isStrand1()){
            //OT and CTOT reads, no need to complement these reads as they are already in the forward direction
            std::vector<string> codesAndQuality1 = CTandCTOTReadCoder(this->reference_seq1,this->alignSequence1,this->qualityList1,'G','C','T');
            this->code1 = codesAndQuality1[0];
            this->gcQuality1 = codesAndQuality1[1];
            vector<string> codesAndQuality2 = CTandCTOTReadCoder(this->reference_seq2,this->alignSequence2,this->qualityList2,'G','C','T');
            this->code2 = codesAndQuality2[0];
            this->gcQuality2 = codesAndQuality2[1];

    }else if(!this->strand1){
            //OB and CTOB reads. We need to complement these reads since we want the original reverse strand reads
            this->sequence1 = ShortDnaSequence(complement(this->sequence1.toString()), this->sequence1.qualityString());
            this->reference_seq1 = complement(this->reference_seq1);
            this->alignSequence1 = complement(this->alignSequence1);
            this->sequence2 = ShortDnaSequence(complement(this->sequence2.toString()), this->sequence2.qualityString());
            this->reference_seq2 = complement(this->reference_seq2);
            this->alignSequence2 = complement(this->alignSequence2);
            vector<string> codesAndQuality1 = OBandCTOBReadCoder(this->reference_seq1,this->alignSequence1,this->qualityList1,'G','C','T');
            this->code1 = codesAndQuality1[0];
            this->gcQuality1 = codesAndQuality1[1];
            vector<string> codesAndQuality2 = OBandCTOBReadCoder(this->reference_seq2,this->alignSequence2,this->qualityList2,'G','C','T');
            this->code2 = codesAndQuality2[0];
            this->gcQuality2 = codesAndQuality2[1];

    }
}